

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.hpp
# Opt level: O0

void __thiscall HalfMesh::Mesh::establish_connectivity(Mesh *this)

{
  Face *this_00;
  Edge *pEVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  pointer ppVar5;
  pointer ppVar6;
  size_type sVar7;
  reference ppHVar8;
  reference ppEVar9;
  HalfEdge *pHVar10;
  HalfEdge *halfEdge_2;
  Edge *edge_1;
  uint i_1;
  HalfEdge *half_edge;
  uint i;
  HalfEdge *halfEdge_1;
  Edge *edge;
  _Node_iterator_base<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false> local_38;
  iterator iter_1;
  HalfEdge *halfEdge;
  Face *face;
  _Node_iterator_base<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false> local_18;
  iterator iter;
  Mesh *this_local;
  
  iter.super__Node_iterator_base<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false>)
           (_Node_iterator_base<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false>)this;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<HalfMesh::Face_*,_HalfMesh::HalfEdge_*,_std::hash<HalfMesh::Face_*>,_std::equal_to<HalfMesh::Face_*>,_std::allocator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>_>_>
       ::begin(&this->face_to_one_half_edge_map);
  while( true ) {
    face = (Face *)std::
                   unordered_map<HalfMesh::Face_*,_HalfMesh::HalfEdge_*,_std::hash<HalfMesh::Face_*>,_std::equal_to<HalfMesh::Face_*>,_std::allocator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>_>_>
                   ::end(&this->face_to_one_half_edge_map);
    bVar2 = std::__detail::operator!=
                      (&local_18,
                       (_Node_iterator_base<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false>
                        *)&face);
    if (!bVar2) break;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                         *)&local_18);
    this_00 = ppVar5->first;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                         *)&local_18);
    iter_1.super__Node_iterator_base<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false>)
             ppVar5->second;
    Face::set_one_half_edge
              (this_00,(HalfEdge *)
                       iter_1.
                       super__Node_iterator_base<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false>
                       ._M_cur);
    std::__detail::
    _Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<HalfMesh::Face_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                *)&local_18);
  }
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<HalfMesh::Edge_*,_HalfMesh::HalfEdge_*,_std::hash<HalfMesh::Edge_*>,_std::equal_to<HalfMesh::Edge_*>,_std::allocator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>_>_>
       ::begin(&this->edge_to_one_half_edge_map);
  while( true ) {
    edge = (Edge *)std::
                   unordered_map<HalfMesh::Edge_*,_HalfMesh::HalfEdge_*,_std::hash<HalfMesh::Edge_*>,_std::equal_to<HalfMesh::Edge_*>,_std::allocator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>_>_>
                   ::end(&this->edge_to_one_half_edge_map);
    bVar2 = std::__detail::operator!=
                      (&local_38,
                       (_Node_iterator_base<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false>
                        *)&edge);
    if (!bVar2) break;
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                         *)&local_38);
    pEVar1 = ppVar6->first;
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>::
             operator->((_Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                         *)&local_38);
    Edge::set_one_half_edge(pEVar1,ppVar6->second);
    std::__detail::
    _Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>::operator++
              ((_Node_iterator<std::pair<HalfMesh::Edge_*const,_HalfMesh::HalfEdge_*>,_false,_false>
                *)&local_38);
  }
  half_edge._4_4_ = 0;
  while( true ) {
    sVar7 = std::vector<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>::size
                      (&this->all_half_edges);
    if (sVar7 <= half_edge._4_4_) break;
    ppHVar8 = std::vector<HalfMesh::HalfEdge_*,_std::allocator<HalfMesh::HalfEdge_*>_>::at
                        (&this->all_half_edges,(ulong)half_edge._4_4_);
    pHVar10 = *ppHVar8;
    uVar3 = HalfEdge::get_opposing_half_edge(pHVar10);
    uVar4 = std::numeric_limits<unsigned_int>::max();
    if (uVar3 == uVar4) {
      HalfEdge::set_boundary(pHVar10,true);
    }
    else {
      HalfEdge::set_boundary(pHVar10,false);
    }
    half_edge._4_4_ = half_edge._4_4_ + 1;
  }
  edge_1._4_4_ = 0;
  while( true ) {
    sVar7 = std::vector<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>::size(&this->all_edges)
    ;
    if (sVar7 <= edge_1._4_4_) break;
    ppEVar9 = std::vector<HalfMesh::Edge_*,_std::allocator<HalfMesh::Edge_*>_>::at
                        (&this->all_edges,(ulong)edge_1._4_4_);
    pEVar1 = *ppEVar9;
    pHVar10 = Edge::get_one_half_edge(pEVar1);
    bVar2 = HalfEdge::is_boundary(pHVar10);
    if (bVar2) {
      Edge::set_boundary(pEVar1,true);
    }
    else {
      Edge::set_boundary(pEVar1,false);
    }
    edge_1._4_4_ = edge_1._4_4_ + 1;
  }
  return;
}

Assistant:

void establish_connectivity() {
            for (auto iter = face_to_one_half_edge_map.begin(); iter != face_to_one_half_edge_map.end(); ++iter) {
                Face *face = iter->first;
                HalfEdge *halfEdge = iter->second;
                face->set_one_half_edge(halfEdge);
            }
            for (auto iter = edge_to_one_half_edge_map.begin(); iter != edge_to_one_half_edge_map.end(); ++iter) {
                Edge *edge = iter->first;
                HalfEdge *halfEdge = iter->second;
                edge->set_one_half_edge(halfEdge);
            }
            for (unsigned int i = 0; i < all_half_edges.size(); ++i) {
                HalfEdge *half_edge = all_half_edges.at(i);
                if (half_edge->get_opposing_half_edge() == std::numeric_limits<unsigned int>::max()) {
                    half_edge->set_boundary(true);
                } else {
                    half_edge->set_boundary(false);
                }
            }
            for (unsigned int i = 0; i < all_edges.size(); ++i) {
                Edge *edge = all_edges.at(i);
                HalfEdge *halfEdge = edge->get_one_half_edge();
                if (halfEdge->is_boundary()) {
                    edge->set_boundary(true);
                } else {
                    edge->set_boundary(false);
                }

            }
        }